

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O1

cs_iterator
st_tree::detail::
node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
::_cs_iterator(node_type *n)

{
  int iVar1;
  cs_iterator j;
  node_type *pnVar2;
  _Base_ptr p_Var3;
  cs_iterator cVar4;
  exception *peVar5;
  _Base_ptr *pp_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  string local_38;
  
  if ((n->
      super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
      )._parent == (node_type *)0x0) {
    peVar5 = (exception *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"_cs_iterator(): node has no parent","");
    exception::exception(peVar5,&local_38);
    *(undefined ***)peVar5 = &PTR__exception_0030dfb0;
    __cxa_throw(peVar5,&parent_exception::typeinfo,exception::~exception);
  }
  pnVar2 = node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
           ::parent(&n->
                     super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
                   );
  p_Var7 = (pnVar2->
           super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
           )._children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cVar4._M_node =
       &(pnVar2->
        super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
        )._children._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var8 = cVar4._M_node;
  if (p_Var7 != (_Base_ptr)0x0) {
    iVar1 = (n->
            super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
            )._data.i1;
    do {
      cVar4._M_node = p_Var7;
      if (*(int *)(*(long *)(cVar4._M_node + 1) + 0x20) < iVar1) {
        pp_Var6 = &(cVar4._M_node)->_M_right;
        cVar4._M_node = p_Var8;
      }
      else {
        if (*(int *)(*(long *)(cVar4._M_node + 1) + 0x20) <= iVar1) {
          p_Var3 = (cVar4._M_node)->_M_right;
          for (p_Var7 = (cVar4._M_node)->_M_left; p_Var7 != (_Base_ptr)0x0;
              p_Var7 = (&p_Var7->_M_left)[*(int *)(*(long *)(p_Var7 + 1) + 0x20) < iVar1]) {
            if (iVar1 <= *(int *)(*(long *)(p_Var7 + 1) + 0x20)) {
              cVar4._M_node = p_Var7;
            }
          }
          for (; p_Var3 != (_Base_ptr)0x0;
              p_Var3 = (&p_Var3->_M_left)[*(int *)(*(long *)(p_Var3 + 1) + 0x20) <= iVar1]) {
            if (iVar1 < *(int *)(*(long *)(p_Var3 + 1) + 0x20)) {
              p_Var8 = p_Var3;
            }
          }
          break;
        }
        pp_Var6 = &(cVar4._M_node)->_M_left;
      }
      p_Var7 = *pp_Var6;
      p_Var8 = cVar4._M_node;
    } while (*pp_Var6 != (_Base_ptr)0x0);
  }
  if (cVar4._M_node == p_Var8) {
    peVar5 = (exception *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"_cs_iterator(): requested node does not exist","");
    exception::exception(peVar5,&local_38);
    *(undefined ***)peVar5 = &PTR__exception_0030e0f0;
    __cxa_throw(peVar5,&missing_exception::typeinfo,exception::~exception);
  }
  do {
    if (*(node_type **)(cVar4._M_node + 1) == n) {
      return (cs_iterator)cVar4._M_node;
    }
    cVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar4._M_node);
  } while (cVar4._M_node != p_Var8);
  peVar5 = (exception *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"_cs_iterator(): requested node does not exist","");
  exception::exception(peVar5,&local_38);
  *(undefined ***)peVar5 = &PTR__exception_0030e0f0;
  __cxa_throw(peVar5,&missing_exception::typeinfo,exception::~exception);
}

Assistant:

bool is_root() const { return NULL == _parent; }